

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O3

void __thiscall PythonModuleClient::recv_time(PythonModuleClient *this,uint32_t time)

{
  undefined4 uVar1;
  int iVar2;
  override recv_time;
  long *local_28;
  uint32_t local_1c;
  long *local_18;
  
  local_1c = time;
  uVar1 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            ((char *)&local_28,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar2 = PyObject_IsTrue(local_28);
  if (iVar2 < 0) {
    boost::python::throw_error_already_set();
  }
  else if (iVar2 == 0) {
    *local_28 = *local_28 + -1;
    if (*local_28 == 0) {
      _Py_Dealloc();
    }
    goto LAB_00242c18;
  }
  boost::python::override::operator()((override *)&local_18,(uint *)&local_28);
  if ((local_18 != (long *)0x0) && (*local_18 = *local_18 + -1, *local_18 == 0)) {
    _Py_Dealloc();
  }
  *local_28 = *local_28 + -1;
  if (*local_28 == 0) {
    _Py_Dealloc();
  }
LAB_00242c18:
  PyGILState_Release(uVar1);
  return;
}

Assistant:

void recv_time(uint32_t time){
        PyLockGIL lock;
        if(override recv_time = this->get_override("recv_time")){
            try{
                recv_time(time);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_time in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_time(time);
    }